

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RegexPattern::groupNumberFromName
          (RegexPattern *this,UnicodeString *groupName,UErrorCode *status)

{
  int32_t iVar1;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  iVar1 = uhash_geti_63(this->fNamedCaptureMap,groupName);
  if (iVar1 == 0) {
    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
  }
  return iVar1;
}

Assistant:

int32_t RegexPattern::groupNumberFromName(const UnicodeString &groupName, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return 0;
    }

    // No need to explicitly check for syntactically valid names.
    // Invalid ones will never be in the map, and the lookup will fail.

    int32_t number = uhash_geti(fNamedCaptureMap, &groupName);
    if (number == 0) {
        status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
    }
    return number;
}